

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O0

void __thiscall
tinyusdz::TypedAttributeWithFallback<std::array<float,_4UL>_>::TypedAttributeWithFallback
          (TypedAttributeWithFallback<std::array<float,_4UL>_> *this,
          TypedAttributeWithFallback<std::array<float,_4UL>_> *param_1)

{
  undefined3 uVar1;
  float fVar2;
  TypedAttributeWithFallback<std::array<float,_4UL>_> *param_1_local;
  TypedAttributeWithFallback<std::array<float,_4UL>_> *this_local;
  
  AttrMetas::AttrMetas(&this->_metas,&param_1->_metas);
  std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::vector
            (&this->_paths,&param_1->_paths);
  nonstd::optional_lite::optional<std::array<float,_4UL>_>::optional<std::array<float,_4UL>,_0>
            (&this->_attrib,&param_1->_attrib);
  uVar1 = *(undefined3 *)&param_1->field_0x235;
  fVar2 = (param_1->_fallback)._M_elems[0];
  this->_empty = param_1->_empty;
  *(undefined3 *)&this->field_0x235 = uVar1;
  (this->_fallback)._M_elems[0] = fVar2;
  *(undefined8 *)((this->_fallback)._M_elems + 1) =
       *(undefined8 *)((param_1->_fallback)._M_elems + 1);
  (this->_fallback)._M_elems[3] = (param_1->_fallback)._M_elems[3];
  this->_blocked = param_1->_blocked;
  return;
}

Assistant:

static std::string type_name() { return value::TypeTraits<T>::type_name(); }